

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.hpp
# Opt level: O1

SyncPointVkPtr __thiscall Diligent::CommandQueueVkImpl::GetLastSyncPoint(CommandQueueVkImpl *this)

{
  SpinLock *this_00;
  RefCountersImpl *pRVar1;
  byte bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  SyncPointVkPtr SVar3;
  
  this_00 = (SpinLock *)(in_RSI + 0x80);
  LOCK();
  bVar2 = *(byte *)(in_RSI + 0x80);
  *(byte *)(in_RSI + 0x80) = 1;
  UNLOCK();
  while ((bVar2 & 1) != 0) {
    Threading::SpinLock::Wait(this_00);
    LOCK();
    bVar2 = (this_00->m_IsLocked)._M_base._M_i;
    (this_00->m_IsLocked)._M_base._M_i = true;
    UNLOCK();
  }
  (this->super_ObjectBase<Diligent::ICommandQueueVk>).
  super_RefCountedObject<Diligent::ICommandQueueVk>.super_ICommandQueueVk.super_ICommandQueue.
  super_IObject._vptr_IObject = *(_func_int ***)(in_RSI + 0x88);
  pRVar1 = *(RefCountersImpl **)(in_RSI + 0x90);
  (this->super_ObjectBase<Diligent::ICommandQueueVk>).
  super_RefCountedObject<Diligent::ICommandQueueVk>.m_pRefCounters = pRVar1;
  if (pRVar1 != (RefCountersImpl *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)pRVar1->m_ObjectWrapperBuffer = (int)pRVar1->m_ObjectWrapperBuffer[0] + 1;
      UNLOCK();
    }
    else {
      *(int *)pRVar1->m_ObjectWrapperBuffer = (int)pRVar1->m_ObjectWrapperBuffer[0] + 1;
    }
  }
  Threading::SpinLock::unlock(this_00);
  SVar3.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar3.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SyncPointVkPtr)SVar3.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

SyncPointVkPtr GetLastSyncPoint()
    {
        Threading::SpinLockGuard Guard{m_LastSyncPointLock};
        return m_LastSyncPoint;
    }